

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFileTests.cc
# Opt level: O0

void __thiscall DataFileTest::testReaderGenericByName(DataFileTest *this)

{
  bool bVar1;
  ulong uVar2;
  long *plVar3;
  GenericDatum *pGVar4;
  size_t in_RCX;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  GenericDatum *f1;
  GenericDatum *f0;
  size_t n;
  GenericRecord *r;
  GenericDatum *ci;
  int64_t im;
  int64_t re;
  Pair p;
  int i;
  DataFileReader<std::pair<avro::ValidSchema,_avro::GenericDatum>_> df;
  char *pcVar5;
  int *in_stack_fffffffffffffc10;
  char *in_stack_fffffffffffffc18;
  pair<avro::ValidSchema,_avro::GenericDatum> *in_stack_fffffffffffffc20;
  ValidSchema *in_stack_fffffffffffffc30;
  char *in_stack_fffffffffffffc38;
  sp_counted_base *in_stack_fffffffffffffc40;
  const_string *in_stack_fffffffffffffc48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc58;
  GenericDatum *in_stack_fffffffffffffc60;
  basic_cstring<const_char> local_368;
  undefined1 local_358 [56];
  basic_cstring<const_char> local_320;
  basic_cstring<const_char> local_310;
  undefined1 local_300 [56];
  basic_cstring<const_char> local_2c8;
  pair<avro::ValidSchema,_avro::GenericDatum> local_2b8 [2];
  basic_cstring<const_char> local_268;
  undefined1 local_251 [33];
  GenericDatum *local_230;
  basic_cstring<const_char> local_228;
  undefined1 local_218 [56];
  basic_cstring<const_char> local_1e0;
  pair<avro::ValidSchema,_avro::GenericDatum> local_1d0 [2];
  basic_cstring<const_char> local_180;
  allocator<char> local_169;
  string local_168 [32];
  GenericDatum *local_148;
  size_t local_140;
  basic_cstring<const_char> local_138;
  undefined1 local_128 [56];
  basic_cstring<const_char> local_f0;
  undefined1 local_e0 [20];
  Type local_cc;
  basic_cstring<const_char> local_c8;
  undefined1 local_b8 [56];
  basic_cstring<const_char> local_80;
  GenericDatum *local_70;
  undefined1 local_68 [48];
  undefined1 local_38 [16];
  GenericDatum GStack_28;
  int local_14;
  DataFileReader<std::pair<avro::ValidSchema,_avro::GenericDatum>_> local_10 [2];
  
  avro::DataFileReader<std::pair<avro::ValidSchema,_avro::GenericDatum>_>::DataFileReader
            ((DataFileReader<std::pair<avro::ValidSchema,_avro::GenericDatum>_> *)
             in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
  local_14 = 0;
  avro::GenericDatum::GenericDatum((GenericDatum *)0x2464db);
  std::pair<avro::ValidSchema,_avro::GenericDatum>::pair<avro::GenericDatum,_true>
            (in_stack_fffffffffffffc20,(ValidSchema *)in_stack_fffffffffffffc18,
             (GenericDatum *)in_stack_fffffffffffffc10);
  avro::GenericDatum::~GenericDatum((GenericDatum *)0x246509);
  local_68._8_8_ = (sp_counted_base *)0x3;
  local_68._0_8_ = (element_type *)0x5;
  local_70 = &GStack_28;
  __buf = extraout_RDX;
  while (uVar2 = avro::DataFileReader<std::pair<avro::ValidSchema,_avro::GenericDatum>_>::read
                           (local_10,(int)local_38,__buf,in_RCX), (uVar2 & 1) != 0) {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_80,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
                 ,0x70);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffc10);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffffc60,
                 (const_string *)in_stack_fffffffffffffc58,(size_t)in_stack_fffffffffffffc50,
                 in_stack_fffffffffffffc48);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffffc18,(char (*) [1])in_stack_fffffffffffffc10);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_c8,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
                 ,0x70);
      local_cc = avro::GenericDatum::type(local_70);
      local_e0._16_4_ = AVRO_RECORD;
      in_stack_fffffffffffffc18 = "avro::AVRO_RECORD";
      in_stack_fffffffffffffc10 = (int *)(local_e0 + 0x10);
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,avro::Type,avro::Type>
                (local_b8,&local_c8,0x12d,2,2,&local_cc,"ci.type()");
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)0x246672);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    local_e0._8_8_ = avro::GenericDatum::value<avro::GenericRecord>((GenericDatum *)0x24668c);
    local_e0._0_8_ = (element_type *)0x2;
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_f0,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
                 ,0x70);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffc10);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffffc60,
                 (const_string *)in_stack_fffffffffffffc58,(size_t)in_stack_fffffffffffffc50,
                 in_stack_fffffffffffffc48);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffffc18,(char (*) [1])in_stack_fffffffffffffc10);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_138,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
                 ,0x70);
      local_140 = avro::GenericRecord::fieldCount((GenericRecord *)0x24673d);
      in_stack_fffffffffffffc18 = "n";
      in_stack_fffffffffffffc10 = (int *)local_e0;
      pcVar5 = "r.fieldCount()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
                (local_128,&local_138,0x130,2,2,&local_140);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)0x2467a3);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc50,(char *)in_stack_fffffffffffffc48,
               (allocator<char> *)in_stack_fffffffffffffc40);
    in_stack_fffffffffffffc60 =
         avro::GenericRecord::field((GenericRecord *)in_stack_fffffffffffffc10,(string *)pcVar5);
    std::__cxx11::string::~string(local_168);
    std::allocator<char>::~allocator(&local_169);
    local_148 = in_stack_fffffffffffffc60;
    do {
      in_stack_fffffffffffffc58 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_180,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
                 ,0x70);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffc10);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffffc60,
                 (const_string *)in_stack_fffffffffffffc58,(size_t)in_stack_fffffffffffffc50,
                 in_stack_fffffffffffffc48);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffffc18,(char (*) [1])in_stack_fffffffffffffc10);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)&local_1d0[0].first.root_.pn,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
                 ,0x70);
      local_1d0[0].first.root_.px._4_4_ = avro::GenericDatum::type(local_148);
      local_1d0[0].first.root_.px._0_4_ = 3;
      in_stack_fffffffffffffc18 = "avro::AVRO_LONG";
      in_stack_fffffffffffffc10 = (int *)local_1d0;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,avro::Type,avro::Type>
                (&local_1d0[0].second.value_,&local_1d0[0].first.root_.pn,0x132,2,2,
                 (undefined1 *)((long)&local_1d0[0].first.root_.px + 4),"f0.type()");
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)0x246937);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      in_stack_fffffffffffffc50 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_1e0,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
                 ,0x70);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffc10);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffffc60,
                 (const_string *)in_stack_fffffffffffffc58,(size_t)in_stack_fffffffffffffc50,
                 in_stack_fffffffffffffc48);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffffc18,(char (*) [1])in_stack_fffffffffffffc10);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_228,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
                 ,0x70);
      plVar3 = avro::GenericDatum::value<long>((GenericDatum *)0x2469e3);
      in_stack_fffffffffffffc18 = "re";
      in_stack_fffffffffffffc10 = (int *)(local_68 + 8);
      pcVar5 = "f0.value<int64_t>()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                (local_218,&local_228,0x133,1,2,plVar3);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)0x246a3e);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    in_stack_fffffffffffffc48 = (const_string *)local_251;
    in_stack_fffffffffffffc40 = (sp_counted_base *)local_e0._8_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc50,(char *)in_stack_fffffffffffffc48,
               (allocator<char> *)in_stack_fffffffffffffc40);
    pGVar4 = avro::GenericRecord::field((GenericRecord *)in_stack_fffffffffffffc10,(string *)pcVar5)
    ;
    std::__cxx11::string::~string((string *)(local_251 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_251);
    local_230 = pGVar4;
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_268,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
                 ,0x70);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffc10);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffffc60,
                 (const_string *)in_stack_fffffffffffffc58,(size_t)in_stack_fffffffffffffc50,
                 in_stack_fffffffffffffc48);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffffc18,(char (*) [1])in_stack_fffffffffffffc10);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)&local_2b8[0].first.root_.pn,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
                 ,0x70);
      local_2b8[0].first.root_.px._4_4_ = avro::GenericDatum::type(local_230);
      local_2b8[0].first.root_.px._0_4_ = 3;
      in_stack_fffffffffffffc18 = "avro::AVRO_LONG";
      in_stack_fffffffffffffc10 = (int *)local_2b8;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,avro::Type,avro::Type>
                (&local_2b8[0].second.value_,&local_2b8[0].first.root_.pn,0x136,2,2,
                 (undefined1 *)((long)&local_2b8[0].first.root_.px + 4),"f1.type()");
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)0x246bd2);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_2c8,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
                 ,0x70);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffc10);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffffc60,
                 (const_string *)in_stack_fffffffffffffc58,(size_t)in_stack_fffffffffffffc50,
                 in_stack_fffffffffffffc48);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffffc18,(char (*) [1])in_stack_fffffffffffffc10);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_310,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
                 ,0x70);
      plVar3 = avro::GenericDatum::value<long>((GenericDatum *)0x246c7e);
      in_stack_fffffffffffffc18 = "im";
      in_stack_fffffffffffffc10 = (int *)local_68;
      in_RCX = 1;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                (local_300,&local_310,0x137,1,2,plVar3,"f1.value<int64_t>()");
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)0x246cd9);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    local_68._8_8_ = local_68._0_8_ * local_68._8_8_;
    local_68._0_8_ = local_68._0_8_ + 3;
    local_14 = local_14 + 1;
    __buf = extraout_RDX_00;
  }
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_320,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
               ,0x70);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc10);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffc60,
               (const_string *)in_stack_fffffffffffffc58,(size_t)in_stack_fffffffffffffc50,
               in_stack_fffffffffffffc48);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffc18,(char (*) [1])in_stack_fffffffffffffc10);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_368,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
               ,0x70);
    in_stack_fffffffffffffc18 = "count";
    in_stack_fffffffffffffc10 = &count;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_358,&local_368,0x13c,1,2,&local_14,"i");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x246fe8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::pair<avro::ValidSchema,_avro::GenericDatum>::~pair
            ((pair<avro::ValidSchema,_avro::GenericDatum> *)in_stack_fffffffffffffc10);
  avro::DataFileReader<std::pair<avro::ValidSchema,_avro::GenericDatum>_>::~DataFileReader
            ((DataFileReader<std::pair<avro::ValidSchema,_avro::GenericDatum>_> *)0x24700f);
  return;
}

Assistant:

void testReaderGenericByName() {
        avro::DataFileReader<Pair> df(filename, writerSchema);
        int i = 0;
        Pair p(writerSchema, GenericDatum());
        int64_t re = 3;
        int64_t im = 5;

        const GenericDatum& ci = p.second;
        while (df.read(p)) {
            BOOST_REQUIRE_EQUAL(ci.type(), avro::AVRO_RECORD);
            const GenericRecord& r = ci.value<GenericRecord>();
            const size_t n = 2;
            BOOST_REQUIRE_EQUAL(r.fieldCount(), n);
            const GenericDatum& f0 = r.field("re");
            BOOST_REQUIRE_EQUAL(f0.type(), avro::AVRO_LONG);
            BOOST_CHECK_EQUAL(f0.value<int64_t>(), re);

            const GenericDatum& f1 = r.field("im");
            BOOST_REQUIRE_EQUAL(f1.type(), avro::AVRO_LONG);
            BOOST_CHECK_EQUAL(f1.value<int64_t>(), im);
            re *= im;
            im += 3;
            ++i;
        }
        BOOST_CHECK_EQUAL(i, count);
    }